

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

path * __thiscall
ArgsManager::GetPathArg
          (path *__return_storage_ptr__,ArgsManager *this,string arg,path *default_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  path *in_RCX;
  long in_FS_OFFSET;
  path result;
  string path_str;
  path pStack_118;
  path local_f0;
  path local_c8;
  path local_a0;
  string local_78;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsArgNegated(this,(string *)default_value);
  if (bVar2) {
    (__return_storage_ptr__->super_path)._M_pathname.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_path)._M_pathname.field_2 + 8) = 0;
    (__return_storage_ptr__->super_path)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (__return_storage_ptr__->super_path)._M_pathname._M_string_length = 0;
    (__return_storage_ptr__->super_path)._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (_Impl *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_00699424:
      __stack_chk_fail();
    }
    std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path);
  }
  else {
    paVar1 = &local_58._M_pathname.field_2;
    local_58._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    GetArg(&local_78,this,(string *)default_value,&local_58._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_pathname._M_dataplus._M_p,
                      local_58._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_string_length == 0) {
      std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,in_RCX);
    }
    else {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_58,&local_78,auto_format);
      std::filesystem::__cxx11::path::path(&local_f0,&local_58);
      std::filesystem::__cxx11::path::~path(&local_58);
      std::filesystem::__cxx11::path::lexically_normal();
      std::filesystem::__cxx11::path::path(&local_a0,&local_c8);
      std::filesystem::__cxx11::path::~path(&local_c8);
      std::filesystem::__cxx11::path::~path(&local_f0);
      cVar3 = std::filesystem::__cxx11::path::has_filename();
      if (cVar3 == '\0') {
        std::filesystem::__cxx11::path::parent_path();
      }
      else {
        std::filesystem::__cxx11::path::path(&pStack_118,&local_a0);
      }
      std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&pStack_118);
      std::filesystem::__cxx11::path::~path(&pStack_118);
      std::filesystem::__cxx11::path::~path(&local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00699424;
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path ArgsManager::GetPathArg(std::string arg, const fs::path& default_value) const
{
    if (IsArgNegated(arg)) return fs::path{};
    std::string path_str = GetArg(arg, "");
    if (path_str.empty()) return default_value;
    fs::path result = fs::PathFromString(path_str).lexically_normal();
    // Remove trailing slash, if present.
    return result.has_filename() ? result : result.parent_path();
}